

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.h
# Opt level: O1

void psset_alloc_container_remove(psset_t *psset,hpdata_t *ps)

{
  hpdata_t *phVar1;
  byte bVar2;
  _Bool _Var3;
  pszind_t pVar4;
  
  ps->h_in_psset_alloc_container = false;
  if (ps->h_nactive != 0x200) {
    if (ps->h_nactive == 0) {
      phVar1 = (psset->empty).head.qlh_first;
      if (phVar1 == ps) {
        (psset->empty).head.qlh_first = (hpdata_t *)(phVar1->field_13).age_link.link.prev;
      }
      if ((psset->empty).head.qlh_first == ps) {
        (psset->empty).head.qlh_first = (hpdata_t *)0x0;
      }
      else {
        (((ps->field_13).ql_link_empty.qre_prev)->field_13).age_link.link.prev =
             (((ps->field_13).ql_link_empty.qre_next)->field_13).age_link.link.next;
        (((ps->field_13).ql_link_empty.qre_next)->field_13).age_link.link.next =
             (ps->field_13).age_link.link.next;
        phVar1 = (ps->field_13).ql_link_empty.qre_next;
        (ps->field_13).age_link.link.next =
             (((ps->field_13).ql_link_empty.qre_prev)->field_13).age_link.link.prev;
        (((phVar1->field_13).ql_link_empty.qre_prev)->field_13).ql_link_empty.qre_next = phVar1;
        (((ps->field_13).ql_link_empty.qre_prev)->field_13).ql_link_empty.qre_next = ps;
      }
    }
    else {
      pVar4 = psset_hpdata_heap_index(ps);
      duckdb_je_hpdata_age_heap_remove(psset->pageslabs + pVar4,ps);
      _Var3 = duckdb_je_hpdata_age_heap_empty(psset->pageslabs + pVar4);
      if (_Var3) {
        bVar2 = (byte)pVar4 & 0x3f;
        psset->pageslab_bitmap[pVar4 >> 6] =
             psset->pageslab_bitmap[pVar4 >> 6] &
             (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
    }
  }
  return;
}

Assistant:

static inline void
hpdata_in_psset_alloc_container_set(hpdata_t *hpdata, bool in_container) {
	assert(in_container != hpdata->h_in_psset_alloc_container);
	hpdata->h_in_psset_alloc_container = in_container;
}